

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSetTest_Subset_Test::
~MessageDifferencerTest_RepeatedFieldSetTest_Subset_Test
          (MessageDifferencerTest_RepeatedFieldSetTest_Subset_Test *this)

{
  MessageDifferencerTest_RepeatedFieldSetTest_Subset_Test *this_local;
  
  ~MessageDifferencerTest_RepeatedFieldSetTest_Subset_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSetTest_Subset) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  msg1.add_rv(3);
  msg1.add_rv(8);
  msg1.add_rv(2);
  msg2.add_rv(2);
  msg2.add_rv(3);
  msg2.add_rv(5);
  msg2.add_rv(8);

  util::MessageDifferencer differencer;

  // Fail with only partial scope set.
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.set_repeated_field_comparison(util::MessageDifferencer::AS_LIST);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));

  // Fail with only set-like comparison set.
  differencer.set_scope(util::MessageDifferencer::FULL);
  differencer.set_repeated_field_comparison(util::MessageDifferencer::AS_SET);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));

  // Succeed with scope and repeated field comparison set properly.
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.set_repeated_field_comparison(util::MessageDifferencer::AS_SET);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}